

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

Value * __thiscall GlobOptBlockData::FindValue(GlobOptBlockData *this,Sym *sym)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  StackSym *pSVar4;
  Value *pVVar5;
  StackSym *local_20;
  Sym *sym_local;
  GlobOptBlockData *this_local;
  
  if (this->symToValueMap == (GlobHashTable *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x508,"(this->symToValueMap)","this->symToValueMap");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = Sym::IsStackSym(sym);
  if (bVar2) {
    pSVar4 = Sym::AsStackSym(sym);
    bVar2 = StackSym::IsTypeSpec(pSVar4);
    if (bVar2) {
      pSVar4 = Sym::AsStackSym(sym);
      local_20 = StackSym::GetVarEquivSym(pSVar4,this->globOpt->func);
      goto LAB_005ef315;
    }
  }
  bVar2 = Sym::IsPropertySym(sym);
  local_20 = (StackSym *)sym;
  if (bVar2) {
    pVVar5 = FindPropertyValue(this,sym->m_id);
    return pVVar5;
  }
LAB_005ef315:
  bVar2 = Sym::IsStackSym(&local_20->super_Sym);
  if (bVar2) {
    pSVar4 = Sym::AsStackSym(&local_20->super_Sym);
    bVar2 = StackSym::IsFromByteCodeConstantTable(pSVar4);
    if (bVar2) {
      pVVar5 = SparseArray<Value>::Get
                         (this->globOpt->byteCodeConstantValueArray,(local_20->super_Sym).m_id);
      return pVVar5;
    }
  }
  pVVar5 = FindValueFromMapDirect(this,(local_20->super_Sym).m_id);
  return pVVar5;
}

Assistant:

Value*
GlobOptBlockData::FindValue(Sym *sym)
{
    Assert(this->symToValueMap);

    if (sym->IsStackSym() && sym->AsStackSym()->IsTypeSpec())
    {
        sym = sym->AsStackSym()->GetVarEquivSym(this->globOpt->func);
    }
    else if (sym->IsPropertySym())
    {
        return this->FindPropertyValue(sym->m_id);
    }

    if (sym->IsStackSym() && sym->AsStackSym()->IsFromByteCodeConstantTable())
    {
        return this->globOpt->byteCodeConstantValueArray->Get(sym->m_id);
    }
    else
    {
        return FindValueFromMapDirect(sym->m_id);
    }
}